

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.hpp
# Opt level: O0

void __thiscall
OpenMD::SelectionEvaluator::unrecognizedIdentifier(SelectionEvaluator *this,string *identifier)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  SelectionEvaluator *in_RDI;
  string *in_stack_ffffffffffffffa8;
  string local_30 [32];
  
  std::operator+((char *)in_RDI,in_RSI);
  evalError(in_RDI,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void unrecognizedIdentifier(const std::string& identifier) {
      evalError("unrecognized identifier:" + identifier);
    }